

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void mzd_from_bitstream(bitstream_t *bs,mzd_local_t *v,size_t width,size_t size)

{
  uint64_t uVar1;
  ulong in_RCX;
  long in_RDX;
  uint64_t *in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *f;
  uint64_t *d;
  ulong local_38;
  uint64_t *local_28;
  
  local_28 = in_RSI + in_RDX + -1;
  for (local_38 = in_RCX; 0x3f < local_38; local_38 = local_38 - 0x40) {
    uVar1 = bitstream_get_bits(in_RDI,0x40);
    *local_28 = uVar1;
    local_28 = local_28 + -1;
  }
  if (local_38 != 0) {
    uVar1 = bitstream_get_bits(in_RDI,(uint)local_38);
    *local_28 = uVar1 << (0x40U - (char)local_38 & 0x3f);
    local_28 = local_28 + -1;
  }
  for (; in_RSI <= local_28; local_28 = local_28 + -1) {
    *local_28 = 0;
  }
  return;
}

Assistant:

static inline void mzd_from_bitstream(bitstream_t* bs, mzd_local_t* v, const size_t width,
                                      const size_t size) {
  uint64_t* d = &BLOCK(v, 0)->w64[width - 1];
  uint64_t* f = BLOCK(v, 0)->w64;

  size_t bits = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
    --d;
  }
  for (; d >= f; --d) {
    *d = 0;
  }
}